

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxu32 SyMemcpy(void *pSrc,void *pDest,sxu32 nLen)

{
  sxu32 sVar1;
  int iVar2;
  long lVar3;
  
  sVar1 = 0;
  if ((pDest != (void *)0x0 && pSrc != (void *)0x0) && (sVar1 = nLen, pSrc != pDest && nLen != 0)) {
    lVar3 = 0;
    do {
      *(undefined1 *)((long)pDest + lVar3) = *(undefined1 *)((long)pSrc + lVar3);
      iVar2 = (int)lVar3;
      if (nLen - 1 == iVar2) {
        return nLen;
      }
      *(undefined1 *)((long)pDest + lVar3 + 1) = *(undefined1 *)((long)pSrc + lVar3 + 1);
      if (nLen - 2 == iVar2) {
        return nLen;
      }
      *(undefined1 *)((long)pDest + lVar3 + 2) = *(undefined1 *)((long)pSrc + lVar3 + 2);
      if (nLen - 3 == iVar2) {
        return nLen;
      }
      *(undefined1 *)((long)pDest + lVar3 + 3) = *(undefined1 *)((long)pSrc + lVar3 + 3);
      lVar3 = lVar3 + 4;
    } while (nLen != (sxu32)lVar3);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxu32 SyMemcpy(const void *pSrc, void *pDest, sxu32 nLen)
{
	if( pSrc == 0 || pDest == 0 ){
		return 0;
	}
	if( pSrc == (const void *)pDest ){
		return nLen;
	}
	SX_MACRO_FAST_MEMCPY(pSrc, pDest, nLen);
	return nLen;
}